

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

QcSocket * qc_socket_create(int family,int type,int protocol)

{
  int iVar1;
  QcSocket *sock;
  int protocol_local;
  int type_local;
  int family_local;
  
  _type_local = (QcSocket *)malloc(4);
  if (_type_local != (QcSocket *)0x0) {
    memset(_type_local,0,4);
    iVar1 = socket(family,type,protocol);
    _type_local->sockfd = iVar1;
    if (_type_local->sockfd < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x42,"socket create failed");
      free(_type_local);
      _type_local = (QcSocket *)0x0;
    }
    return _type_local;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x3d);
  __assert_fail("sock",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x3d,"QcSocket *qc_socket_create(int, int, int)");
}

Assistant:

QcSocket* qc_socket_create(int family, int type, int protocol)
{
    QcSocket *sock;

    qc_malloc(sock, sizeof(QcSocket));

    sock->sockfd = (int)socket(family, type, protocol);
    if(sock->sockfd < 0)
    {
        qc_error("socket create failed");
        qc_free(sock);
        return NULL;
    }

    return sock;
}